

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O3

bool __thiscall
glcts::anon_unknown_0::BasicBuiltinVariables::RunIteration
          (BasicBuiltinVariables *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  GLuint *buffers;
  CallLogWrapper *this_00;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  int i;
  GLuint GVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  ostream *poVar10;
  uint *puVar12;
  uint *puVar13;
  uint uVar14;
  uint uVar15;
  undefined1 (*pauVar16) [16];
  bool *compile_error;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uvec3 global_size;
  vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> data;
  int local_1f0 [4];
  ulong local_1e0;
  string local_1d8;
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  ulong uVar11;
  
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  local_1f0[2] = 0;
  local_1f0[0] = 0;
  local_1f0[1] = 0;
  lVar9 = 0;
  do {
    local_1f0[lVar9] = num_groups->m_data[lVar9] * param_1->m_data[lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b8 + 0x10),"\nlayout(local_size_x = ",0x17);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,", local_size_y = ",0x11);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,", local_size_z = ",0x11);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,") in;\nconst uvec3 kGlobalSize = uvec3(",0x26);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,");\nlayout(std430) buffer OutputBuffer {\n  uvec4 num_work_groups[",0x40);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"];\n  uvec4 work_group_size[",0x1b);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"];\n  uvec4 work_group_id[",0x19);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,"];\n  uvec4 local_invocation_id[",0x1f);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,"];\n  uvec4 global_invocation_id[",0x20);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,"];\n  uvec4 local_invocation_index[",0x22);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,
             "];\n} g_out_buffer;\nvoid main() {\n  if ((gl_WorkGroupSize * gl_WorkGroupID + gl_LocalInvocationID) != gl_GlobalInvocationID) return;\n  uint global_index = gl_GlobalInvocationID.x +\n                      gl_GlobalInvocationID.y * kGlobalSize.x +\n                      gl_GlobalInvocationID.z * kGlobalSize.x * kGlobalSize.y;\n  g_out_buffer.num_work_groups[global_index] = uvec4(gl_NumWorkGroups, 0);\n  g_out_buffer.work_group_size[global_index] = uvec4(gl_WorkGroupSize, 0);\n  g_out_buffer.work_group_id[global_index] = uvec4(gl_WorkGroupID, 0);\n  g_out_buffer.local_invocation_id[global_index] = uvec4(gl_LocalInvocationID, 0);\n  g_out_buffer.global_invocation_id[global_index] = uvec4(gl_GlobalInvocationID, 0);\n  g_out_buffer.local_invocation_index[global_index] = uvec4(gl_LocalInvocationIndex);\n}"
             ,799);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  GVar6 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_1d8);
  this->m_program = GVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    GVar6 = this->m_program;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,GVar6);
  bVar5 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  if (bVar5) {
    uVar7 = num_groups->m_data[0] * param_1->m_data[0] * param_1->m_data[1] * num_groups->m_data[1]
            * param_1->m_data[2] * num_groups->m_data[2];
    uVar11 = (ulong)uVar7;
    uVar1 = uVar7 * 2;
    local_1e0 = (ulong)(uVar7 * 6);
    std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
    vector((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> *)
           local_1b8,local_1e0,(allocator_type *)&local_1d8);
    buffers = &this->m_storage_buffer;
    GVar6 = this->m_storage_buffer;
    if (GVar6 == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
      GVar6 = *buffers;
    }
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,GVar6);
    uVar18 = uVar11 * 0x60;
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,uVar18,(void *)local_1b8._0_8_,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    if (dispatch_indirect) {
      GVar6 = this->m_dispatch_buffer;
      if (GVar6 == 0) {
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
        GVar6 = this->m_dispatch_buffer;
      }
      glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,GVar6);
      glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,num_groups,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
    }
    else {
      glu::CallLogWrapper::glDispatchCompute
                (this_00,num_groups->m_data[0],num_groups->m_data[1],num_groups->m_data[2]);
    }
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*buffers);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    puVar12 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,uVar18,1);
    uVar14 = 0;
    if (uVar7 != 0) {
      uVar17 = 0;
      puVar13 = puVar12;
      do {
        auVar19._0_4_ = -(uint)(*puVar13 == num_groups->m_data[0]);
        auVar19._4_4_ = -(uint)(puVar13[1] == (uint)*(undefined8 *)(num_groups->m_data + 1));
        auVar19._8_4_ =
             -(uint)(puVar13[2] == (uint)((ulong)*(undefined8 *)(num_groups->m_data + 1) >> 0x20));
        auVar19._12_4_ = -(uint)(puVar13[3] == 0);
        uVar14 = movmskps((int)uVar18,auVar19);
        uVar18 = (ulong)uVar14;
        if (uVar14 != 0xf) {
          bVar5 = false;
          anon_unknown_0::Output("gl_NumWorkGroups: Invalid data at index %d.\n");
          goto LAB_00c0e44d;
        }
        uVar17 = uVar17 + 1;
        puVar13 = puVar13 + 4;
      } while (uVar11 != uVar17);
      uVar14 = uVar1;
      if (0 < (int)uVar7) {
        puVar13 = puVar12 + uVar11 * 4;
        uVar18 = uVar11;
        uVar17 = uVar11;
        do {
          auVar20._0_4_ = -(uint)(*puVar13 == param_1->m_data[0]);
          auVar20._4_4_ = -(uint)(puVar13[1] == (uint)*(undefined8 *)(param_1->m_data + 1));
          auVar20._8_4_ =
               -(uint)(puVar13[2] == (uint)((ulong)*(undefined8 *)(param_1->m_data + 1) >> 0x20));
          auVar20._12_4_ = -(uint)(puVar13[3] == 0);
          uVar15 = movmskps((int)uVar18,auVar20);
          uVar18 = (ulong)uVar15;
          if (uVar15 != 0xf) {
            bVar5 = false;
            anon_unknown_0::Output("gl_WorkGroupSize: Invalid data at index %d.\n");
            goto LAB_00c0e44d;
          }
          uVar15 = (int)uVar17 + 1;
          uVar17 = (ulong)uVar15;
          puVar13 = puVar13 + 4;
        } while (uVar15 < uVar1);
      }
    }
    uVar1 = uVar7 * 3;
    if (uVar14 < uVar1) {
      pauVar16 = (undefined1 (*) [16])(puVar12 + (ulong)uVar14 * 4);
      uVar18 = 0;
      do {
        uVar17 = (ulong)(num_groups->m_data[0] * param_1->m_data[0]);
        uVar3 = (uVar18 & 0xffffffff) / uVar17;
        uVar2 = (ulong)(num_groups->m_data[1] * param_1->m_data[1]);
        auVar19 = *pauVar16;
        iVar8 = (int)((uVar3 / uVar2) / (ulong)param_1->m_data[2]);
        auVar21._0_4_ =
             -(uint)((int)(((uVar18 & 0xffffffff) % uVar17) / (ulong)param_1->m_data[0]) ==
                    auVar19._0_4_);
        auVar21._4_4_ = -(uint)((int)((uVar3 % uVar2) / (ulong)param_1->m_data[1]) == auVar19._4_4_)
        ;
        auVar21._8_4_ = -(uint)(iVar8 == auVar19._8_4_);
        auVar21._12_4_ = -(uint)(auVar19._12_4_ == 0);
        iVar8 = movmskps(iVar8,auVar21);
        if (iVar8 != 0xf) {
          bVar5 = false;
          anon_unknown_0::Output
                    ("gl_WorkGroupID: Invalid data at index %d.\n",(ulong)(uVar14 + (int)uVar18));
          goto LAB_00c0e44d;
        }
        uVar18 = uVar18 + 1;
        pauVar16 = pauVar16 + 1;
      } while (uVar11 != uVar18);
    }
    uVar14 = uVar7 * 4;
    if (uVar1 < uVar14) {
      pauVar16 = (undefined1 (*) [16])(puVar12 + (ulong)uVar1 * 4);
      uVar18 = 0;
      do {
        uVar17 = (ulong)(num_groups->m_data[0] * param_1->m_data[0]);
        uVar3 = (uVar18 & 0xffffffff) / uVar17;
        uVar2 = (ulong)(num_groups->m_data[1] * param_1->m_data[1]);
        uVar4 = uVar3 / uVar2;
        auVar19 = *pauVar16;
        auVar22._0_4_ =
             -(uint)((int)(((uVar18 & 0xffffffff) % uVar17) % (ulong)param_1->m_data[0]) ==
                    auVar19._0_4_);
        auVar22._4_4_ = -(uint)((int)((uVar3 % uVar2) % (ulong)param_1->m_data[1]) == auVar19._4_4_)
        ;
        auVar22._8_4_ = -(uint)((int)(uVar4 % (ulong)param_1->m_data[2]) == auVar19._8_4_);
        auVar22._12_4_ = -(uint)(auVar19._12_4_ == 0);
        iVar8 = movmskps((int)(uVar4 / param_1->m_data[2]),auVar22);
        if (iVar8 != 0xf) {
          bVar5 = false;
          anon_unknown_0::Output
                    ("gl_LocalInvocationID: Invalid data at index %d.\n",
                     (ulong)(uVar1 + (int)uVar18));
          goto LAB_00c0e44d;
        }
        uVar18 = uVar18 + 1;
        pauVar16 = pauVar16 + 1;
      } while (uVar11 != uVar18);
    }
    uVar7 = uVar7 * 5;
    if (uVar14 < uVar7) {
      uVar18 = (ulong)(num_groups->m_data[0] * param_1->m_data[0]);
      pauVar16 = (undefined1 (*) [16])(puVar12 + (ulong)uVar14 * 4);
      uVar17 = 0;
      do {
        uVar3 = (uVar17 & 0xffffffff) / uVar18;
        uVar2 = (ulong)(num_groups->m_data[1] * param_1->m_data[1]);
        auVar19 = *pauVar16;
        iVar8 = (int)(uVar3 / uVar2);
        auVar23._0_4_ = -(uint)((int)((uVar17 & 0xffffffff) % uVar18) == auVar19._0_4_);
        auVar23._4_4_ = -(uint)((int)(uVar3 % uVar2) == auVar19._4_4_);
        auVar23._8_4_ = -(uint)(iVar8 == auVar19._8_4_);
        auVar23._12_4_ = -(uint)(auVar19._12_4_ == 0);
        iVar8 = movmskps(iVar8,auVar23);
        if (iVar8 != 0xf) {
          bVar5 = false;
          anon_unknown_0::Output
                    ("gl_GlobalInvocationID: Invalid data at index %d.\n",
                     (ulong)(uVar14 + (int)uVar17));
          goto LAB_00c0e44d;
        }
        uVar17 = uVar17 + 1;
        pauVar16 = pauVar16 + 1;
      } while (uVar11 != uVar17);
    }
    if (uVar7 < (uint)local_1e0) {
      uVar1 = param_1->m_data[0];
      uVar14 = param_1->m_data[1];
      puVar12 = puVar12 + (ulong)uVar7 * 4;
      uVar18 = 0;
      do {
        uVar17 = (ulong)(num_groups->m_data[0] * uVar1);
        uVar3 = (uVar18 & 0xffffffff) / uVar17;
        uVar17 = (uVar18 & 0xffffffff) % uVar17;
        uVar2 = (ulong)(num_groups->m_data[1] * uVar14);
        uVar15 = (int)(uVar17 % (ulong)uVar1) +
                 ((int)((uVar3 % uVar2) % (ulong)uVar14) +
                 (int)((uVar3 / uVar2) % (ulong)param_1->m_data[2]) * uVar14) * uVar1;
        auVar24._0_4_ = -(uint)(*puVar12 == uVar15);
        auVar24._4_4_ = -(uint)(puVar12[1] == uVar15);
        auVar24._8_4_ = -(uint)(puVar12[2] == uVar15);
        auVar24._12_4_ = -(uint)(puVar12[3] == uVar15);
        iVar8 = movmskps((int)(uVar17 / uVar1),auVar24);
        if (iVar8 != 0xf) {
          bVar5 = false;
          anon_unknown_0::Output
                    ("gl_LocalInvocationIndex: Invalid data at index %d.\n",
                     (ulong)(uVar7 + (int)uVar18));
          goto LAB_00c0e44d;
        }
        uVar18 = uVar18 + 1;
        puVar12 = puVar12 + 4;
      } while (uVar11 != uVar18);
    }
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    bVar5 = true;
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
LAB_00c0e44d:
    if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ - local_1b8._0_8_);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		const GLuint kBufferSize =
			local_size.x() * num_groups.x() * local_size.y() * num_groups.y() * local_size.z() * num_groups.z();

		std::vector<uvec4> data(kBufferSize * 6);
		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(uvec4) * kBufferSize * 6, &data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		uvec4* result;
		result = static_cast<uvec4*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(uvec4) * kBufferSize * 6, GL_MAP_READ_BIT));

		// gl_NumWorkGroups
		for (GLuint index = 0; index < kBufferSize; ++index)
		{
			if (!IsEqual(result[index], uvec4(num_groups.x(), num_groups.y(), num_groups.z(), 0)))
			{
				Output("gl_NumWorkGroups: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_WorkGroupSize
		for (GLuint index = kBufferSize; index < 2 * kBufferSize; ++index)
		{
			if (!IsEqual(result[index], uvec4(local_size.x(), local_size.y(), local_size.z(), 0)))
			{
				Output("gl_WorkGroupSize: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_WorkGroupID
		for (GLuint index = 2 * kBufferSize; index < 3 * kBufferSize; ++index)
		{
			uvec3 expected = IndexTo3DCoord(index - 2 * kBufferSize, local_size.x() * num_groups.x(),
											local_size.y() * num_groups.y());
			expected.x() /= local_size.x();
			expected.y() /= local_size.y();
			expected.z() /= local_size.z();
			if (!IsEqual(result[index], uvec4(expected.x(), expected.y(), expected.z(), 0)))
			{
				Output("gl_WorkGroupID: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_LocalInvocationID
		for (GLuint index = 3 * kBufferSize; index < 4 * kBufferSize; ++index)
		{
			uvec3 expected = IndexTo3DCoord(index - 3 * kBufferSize, local_size.x() * num_groups.x(),
											local_size.y() * num_groups.y());
			expected.x() %= local_size.x();
			expected.y() %= local_size.y();
			expected.z() %= local_size.z();
			if (!IsEqual(result[index], uvec4(expected.x(), expected.y(), expected.z(), 0)))
			{
				Output("gl_LocalInvocationID: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_GlobalInvocationID
		for (GLuint index = 4 * kBufferSize; index < 5 * kBufferSize; ++index)
		{
			uvec3 expected = IndexTo3DCoord(index - 4 * kBufferSize, local_size.x() * num_groups.x(),
											local_size.y() * num_groups.y());
			if (!IsEqual(result[index], uvec4(expected.x(), expected.y(), expected.z(), 0)))
			{
				Output("gl_GlobalInvocationID: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_LocalInvocationIndex
		for (GLuint index = 5 * kBufferSize; index < 6 * kBufferSize; ++index)
		{
			uvec3 coord = IndexTo3DCoord(index - 5 * kBufferSize, local_size.x() * num_groups.x(),
										 local_size.y() * num_groups.y());
			const GLuint expected = (coord.x() % local_size.x()) + (coord.y() % local_size.y()) * local_size.x() +
									(coord.z() % local_size.z()) * local_size.x() * local_size.y();
			if (!IsEqual(result[index], uvec4(expected)))
			{
				Output("gl_LocalInvocationIndex: Invalid data at index %d.\n", index);
				return false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		return true;
	}